

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O2

void mergesort_2way_parallel(uchar **strings,size_t n,uchar **tmp)

{
  ulong n_00;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,(size_t)tmp);
    return;
  }
  n_00 = n >> 1;
  mergesort_2way_parallel(strings,n_00,tmp);
  mergesort_2way_parallel(strings + n_00,n - n_00,tmp + n_00);
  merge_2way(strings,n_00,strings + n_00,n - n_00,tmp);
  memcpy(strings,tmp,n << 3);
  return;
}

Assistant:

static void
mergesort_2way_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/2;
#pragma omp parallel sections
	{
#pragma omp section
		mergesort_2way_parallel(strings,        split0,   tmp);
#pragma omp section
		mergesort_2way_parallel(strings+split0, n-split0, tmp+split0);
	}
	merge_2way(strings, split0,
	           strings+split0, n-split0,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}